

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_7b0417::HandleHashCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  pointer pbVar1;
  bool bVar2;
  string_view input;
  string_view value;
  string_view algo;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string out;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> local_40;
  string local_38;
  
  a = (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)a == 0x60) {
    algo._M_str = (char *)a->_M_string_length;
    algo._M_len = (size_t)&local_40;
    cmCryptoHash::New(algo);
    bVar2 = (tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)
            local_40._M_t.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>.
            _M_t.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
            super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl !=
            (_Head_base<0UL,_cmCryptoHash_*,_false>)0x0;
    if (bVar2) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      input._M_str = pbVar1[2]._M_dataplus._M_p;
      input._M_len = pbVar1[2]._M_string_length;
      cmCryptoHash::HashString_abi_cxx11_
                (&local_38,
                 (cmCryptoHash *)
                 local_40._M_t.
                 super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
                 super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                 super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl,input);
      value._M_str = local_38._M_dataplus._M_p;
      value._M_len = local_38._M_string_length;
      cmMakefile::AddDefinition
                (status->Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,value);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr(&local_40);
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[49]>
              (&local_38,a,(char (*) [49])" requires an output variable and an input string");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_38);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HandleHashCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  std::unique_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0]));
  if (hash) {
    std::string out = hash->HashFile(args[1]);
    if (!out.empty()) {
      status.GetMakefile().AddDefinition(args[2], out);
      return true;
    }
    status.SetError(cmStrCat(args[0], " failed to read file \"", args[1],
                             "\": ", cmSystemTools::GetLastSystemError()));
  }
  return false;
#else
  status.SetError(cmStrCat(args[0], " not available during bootstrap"));
  return false;
#endif
}